

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

ktx_error_code_e ktxPrintInfoForMemory(ktx_uint8_t *bytes,ktx_size_t size)

{
  ktx_error_code_e kVar1;
  ktxStream stream;
  ktxStream kStack_68;
  
  kVar1 = ktxMemStream_construct_ro(&kStack_68,bytes,size);
  if (kVar1 == KTX_SUCCESS) {
    kVar1 = ktxPrintInfoForStream(&kStack_68);
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxPrintInfoForMemory(const ktx_uint8_t* bytes, ktx_size_t size)
{
    KTX_error_code result;
    ktxStream stream;

    result = ktxMemStream_construct_ro(&stream, bytes, size);
    if (result == KTX_SUCCESS)
        result = ktxPrintInfoForStream(&stream);
    return result;
}